

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase682::run(TestCase682 *this)

{
  PathPtr fromPath;
  PathPtr toPath;
  Directory *pDVar1;
  Directory *fromDirectory;
  int iVar2;
  InMemoryFileFactory *pIVar3;
  ArrayPtr<const_kj::StringPtr> parts;
  PathPtr path;
  StringPtr text;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_00;
  StringPtr text_00;
  StringPtr name;
  StringPtr name_00;
  ArrayPtr<const_kj::StringPtr> parts_01;
  PathPtr path_01;
  ArrayPtr<const_kj::StringPtr> parts_02;
  PathPtr path_02;
  ArrayPtr<const_kj::StringPtr> parts_03;
  ArrayPtr<const_kj::StringPtr> parts_04;
  ArrayPtr<const_kj::StringPtr> parts_05;
  DebugExpression<bool> _kjCondition_2;
  undefined7 uStack_12f;
  File *local_128;
  Array<kj::String> local_118;
  undefined8 local_100;
  char *local_f8;
  undefined8 local_f0;
  Own<kj::Directory,_std::nullptr_t> dst;
  Own<kj::Directory,_std::nullptr_t> src;
  Array<char> local_c8;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_b0;
  Array<kj::String> local_a0;
  TestClock clock;
  DebugComparison<kj::String,_const_char_(&)[7]> _kjCondition;
  
  clock.super_Clock._vptr_Clock = (_func_int **)&PTR_now_005887b0;
  clock.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  pIVar3 = defaultInMemoryFileFactory();
  newInMemoryDirectory((kj *)&src,&clock.super_Clock,pIVar3);
  pIVar3 = defaultInMemoryFileFactory();
  newInMemoryDirectory((kj *)&dst,&clock.super_Clock,pIVar3);
  pDVar1 = src.ptr;
  _kjCondition.left.content.ptr = "foo";
  _kjCondition.left.content.size_ = 4;
  _kjCondition.left.content.disposer = (ArrayDisposer *)0x401abd;
  _kjCondition.right = (char (*) [7])&DAT_00000004;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)&_kjCondition;
  Path::Path((Path *)&local_118,parts);
  path.parts.size_ = (size_t)local_118.ptr;
  path.parts.ptr = (String *)pDVar1;
  Directory::openFile((Directory *)&_kjCondition_2,path,(WriteMode)local_118.size_);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll(local_128,text);
  Own<const_kj::File,_std::nullptr_t>::dispose
            ((Own<const_kj::File,_std::nullptr_t> *)&_kjCondition_2);
  Array<kj::String>::~Array(&local_118);
  pDVar1 = src.ptr;
  _kjCondition.left.content.ptr = "foo";
  _kjCondition.left.content.size_ = 4;
  _kjCondition.left.content.disposer = (ArrayDisposer *)0x3f3548;
  _kjCondition.right = (char (*) [7])&DAT_00000004;
  _kjCondition.op.content.ptr = "qux";
  _kjCondition.op.content.size_ = 4;
  parts_00.size_ = 3;
  parts_00.ptr = (StringPtr *)&_kjCondition;
  Path::Path((Path *)&local_118,parts_00);
  path_00.parts.size_ = (size_t)local_118.ptr;
  path_00.parts.ptr = (String *)pDVar1;
  Directory::openFile((Directory *)&_kjCondition_2,path_00,(WriteMode)local_118.size_);
  text_00.content.size_ = 7;
  text_00.content.ptr = "bazqux";
  File::writeAll(local_128,text_00);
  Own<const_kj::File,_std::nullptr_t>::dispose
            ((Own<const_kj::File,_std::nullptr_t> *)&_kjCondition_2);
  Array<kj::String>::~Array(&local_118);
  TestClock::expectChanged(&clock,(FsNode *)src.ptr);
  TestClock::expectUnchanged(&clock,(FsNode *)dst.ptr);
  pDVar1 = dst.ptr;
  name.content.size_ = 5;
  name.content.ptr = "link";
  Path::Path((Path *)&_kjCondition,name);
  fromDirectory = src.ptr;
  toPath.parts.size_ = _kjCondition.left.content.size_;
  toPath.parts.ptr = (String *)_kjCondition.left.content.ptr;
  name_00.content.size_ = 4;
  name_00.content.ptr = "foo";
  Path::Path((Path *)&local_118,name_00);
  fromPath.parts.size_ = local_118.size_;
  fromPath.parts.ptr = local_118.ptr;
  Directory::transfer(pDVar1,toPath,CREATE,fromDirectory,fromPath,LINK);
  Array<kj::String>::~Array(&local_118);
  Array<kj::String>::~Array((Array<kj::String> *)&_kjCondition);
  TestClock::expectUnchanged(&clock,(FsNode *)src.ptr);
  TestClock::expectChanged(&clock,(FsNode *)dst.ptr);
  pDVar1 = dst.ptr;
  local_118.ptr = (String *)0x410ee4;
  local_118.size_ = 5;
  local_118.disposer = (ArrayDisposer *)0x401abd;
  local_100 = 4;
  parts_01.size_ = 2;
  parts_01.ptr = (StringPtr *)&local_118;
  Path::Path((Path *)&local_a0,parts_01);
  path_01.parts.size_ = (size_t)local_a0.ptr;
  path_01.parts.ptr = (String *)pDVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_b0,path_01);
  ReadableFile::readAllText((String *)&local_c8,local_b0.ptr);
  __kjCondition_2 = (_func_int **)local_c8.ptr;
  local_c8.ptr = (char *)0x0;
  local_c8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&_kjCondition_2,(char (*) [7])0x42451a);
  Array<char>::~Array((Array<char> *)&_kjCondition_2);
  Array<char>::~Array(&local_c8);
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&local_b0);
  Array<kj::String>::~Array(&local_a0);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[81],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,699,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"bar\\\"}))->readAllText() == \\\"foobar\\\"\", _kjCondition"
               ,(char (*) [81])
                "failed: expected dst->openFile(Path({\"link\", \"bar\"}))->readAllText() == \"foobar\""
               ,&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  pDVar1 = dst.ptr;
  local_118.ptr = (String *)0x410ee4;
  local_118.size_ = 5;
  local_118.disposer = (ArrayDisposer *)0x3f3548;
  local_100 = 4;
  local_f8 = "qux";
  local_f0 = 4;
  parts_02.size_ = 3;
  parts_02.ptr = (StringPtr *)&local_118;
  Path::Path((Path *)&local_a0,parts_02);
  path_02.parts.size_ = (size_t)local_a0.ptr;
  path_02.parts.ptr = (String *)pDVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_b0,path_02);
  ReadableFile::readAllText((String *)&local_c8,local_b0.ptr);
  __kjCondition_2 = (_func_int **)local_c8.ptr;
  local_c8.ptr = (char *)0x0;
  local_c8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&_kjCondition_2,(char (*) [7])"bazqux");
  Array<char>::~Array((Array<char> *)&_kjCondition_2);
  Array<char>::~Array(&local_c8);
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&local_b0);
  Array<kj::String>::~Array(&local_a0);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[88],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,700,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"baz\\\", \\\"qux\\\"}))->readAllText() == \\\"bazqux\\\"\", _kjCondition"
               ,(char (*) [88])
                "failed: expected dst->openFile(Path({\"link\", \"baz\", \"qux\"}))->readAllText() == \"bazqux\""
               ,&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  pDVar1 = dst.ptr;
  _kjCondition.left.content.ptr = "link";
  _kjCondition.left.content.size_ = 5;
  _kjCondition.left.content.disposer = (ArrayDisposer *)0x401abd;
  _kjCondition.right = (char (*) [7])&DAT_00000004;
  parts_03.size_ = 2;
  parts_03.ptr = (StringPtr *)&_kjCondition;
  Path::Path((Path *)&local_118,parts_03);
  iVar2 = (*(pDVar1->super_ReadableDirectory).super_FsNode._vptr_FsNode[8])
                    (pDVar1,local_118.ptr,local_118.size_);
  _kjCondition_2.value = (bool)(char)iVar2;
  Array<kj::String>::~Array(&local_118);
  if (kj::_::Debug::minSeverity < 3 && (char)iVar2 == '\0') {
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2be,ERROR,
               "\"failed: expected \" \"dst->exists(Path({\\\"link\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [52])"failed: expected dst->exists(Path({\"link\", \"bar\"}))",
               &_kjCondition_2);
  }
  _kjCondition.left.content.ptr = "foo";
  _kjCondition.left.content.size_ = 4;
  _kjCondition.left.content.disposer = (ArrayDisposer *)0x401abd;
  _kjCondition.right = (char (*) [7])&DAT_00000004;
  parts_04.size_ = 2;
  parts_04.ptr = (StringPtr *)&_kjCondition;
  Path::Path((Path *)&local_118,parts_04);
  Directory::remove(src.ptr,(char *)local_118.ptr);
  Array<kj::String>::~Array(&local_118);
  _kjCondition.left.content.ptr = "link";
  _kjCondition.left.content.size_ = 5;
  _kjCondition.left.content.disposer = (ArrayDisposer *)0x401abd;
  _kjCondition.right = (char (*) [7])&DAT_00000004;
  parts_05.size_ = 2;
  parts_05.ptr = (StringPtr *)&_kjCondition;
  Path::Path((Path *)&local_118,parts_05);
  iVar2 = (*((dst.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[8])
                    (dst.ptr,local_118.ptr,local_118.size_);
  __kjCondition_2 = (_func_int **)(CONCAT71(uStack_12f,(byte)iVar2) ^ 1);
  Array<kj::String>::~Array(&local_118);
  if (((byte)iVar2 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[53],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2c0,ERROR,
               "\"failed: expected \" \"!dst->exists(Path({\\\"link\\\", \\\"bar\\\"}))\", _kjCondition"
               ,(char (*) [53])"failed: expected !dst->exists(Path({\"link\", \"bar\"}))",
               &_kjCondition_2);
  }
  Own<kj::Directory,_std::nullptr_t>::dispose(&dst);
  Own<kj::Directory,_std::nullptr_t>::dispose(&src);
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }